

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

IPGMContext * __thiscall
r_exec::IPGMContext::operator*(IPGMContext *__return_storage_ptr__,IPGMContext *this)

{
  PGMOverlay *pPVar1;
  Overlay *pOVar2;
  undefined1 uVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  uint16_t uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Code *pCVar12;
  Atom *pAVar13;
  Code *pCVar14;
  View *pVVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  P *this_00;
  uint *puVar16;
  undefined8 extraout_RDX;
  IPGMContext local_2d0;
  uint16_t local_2a0;
  undefined2 uStack_29e;
  Data DStack_29c;
  Code *parent_object;
  undefined1 local_268 [8];
  IPGMContext parent;
  View *input_view;
  Code *input_object;
  IPGMContext local_1c8;
  IPGMContext local_198;
  IPGMContext local_168;
  ushort local_132;
  undefined1 local_130 [6];
  uint16_t i;
  undefined1 local_100 [8];
  IPGMContext c;
  Code *o;
  IPGMContext local_98;
  undefined4 local_68;
  uint16_t local_62;
  undefined1 local_60 [6];
  uint16_t unused_index;
  IPGMContext s;
  uint16_t local_1e;
  undefined4 local_1c;
  uint16_t structure_index;
  Atom a;
  IPGMContext *pIStack_18;
  IPGMContext *this_local;
  
  pIStack_18 = this;
  operator[](this,0);
  uVar3 = r_code::Atom::getDescriptor();
  puVar16 = &switchD_0021059d::switchdataD_002a43d8;
  switch(uVar3) {
  case 0x84:
    pAVar13 = (this->super__Context).code;
    pCVar14 = this->object;
    pVVar15 = this->view;
    operator[](this,0);
    uVar7 = r_code::Atom::asIndex();
    IPGMContext((IPGMContext *)&o,pCVar14,pVVar15,pAVar13,uVar7,
                (InputLessPGMOverlay *)(this->super__Context).overlay,(this->super__Context).data);
    operator*(__return_storage_ptr__,(IPGMContext *)&o);
    ~IPGMContext((IPGMContext *)&o);
    break;
  case 0x85:
    pCVar14 = this->object;
    operator[](this,0);
    uVar8 = r_code::Atom::asIndex();
    iVar11 = (*(pCVar14->super__Object)._vptr__Object[9])
                       (pCVar14,(ulong)uVar8,extraout_RDX,
                        CONCAT62((int6)((ulong)puVar16 >> 0x10),uVar8));
    pVVar15 = (View *)CONCAT44(extraout_var,iVar11);
    c.view = pVVar15;
    iVar11 = (*(pVVar15->super_View).super__Object._vptr__Object[4])(pVVar15,0);
    IPGMContext(__return_storage_ptr__,(Code *)pVVar15,(View *)0x0,
                (Atom *)CONCAT44(extraout_var_00,iVar11),0,(InputLessPGMOverlay *)0x0,REFERENCE);
    break;
  case 0x86:
    pAVar13 = (this->super__Context).code;
    operator[](this,0);
    uVar8 = r_code::Atom::asIndex();
    local_1c = *(undefined4 *)(pAVar13 + (ulong)uVar8 * 4);
    cVar5 = r_code::Atom::getDescriptor();
    if (cVar5 == -0x7c) {
      pAVar13 = (this->super__Context).code;
      local_1e = r_code::Atom::asIndex();
      r_code::Atom::operator=((Atom *)&local_1c,pAVar13 + (ulong)local_1e * 4);
    }
    bVar6 = r_code::Atom::isStructural();
    if ((bVar6 & 1) == 0) {
      pAVar13 = (this->super__Context).code;
      pCVar14 = this->object;
      pVVar15 = this->view;
      operator[](this,0);
      uVar7 = r_code::Atom::asIndex();
      IPGMContext(&local_98,pCVar14,pVVar15,pAVar13,uVar7,
                  (InputLessPGMOverlay *)(this->super__Context).overlay,(this->super__Context).data)
      ;
      operator*(__return_storage_ptr__,&local_98);
      ~IPGMContext(&local_98);
      local_68 = 1;
    }
    else {
      IPGMContext((IPGMContext *)local_60,this->object,this->view,(this->super__Context).code,
                  local_1e,(InputLessPGMOverlay *)(this->super__Context).overlay,
                  (this->super__Context).data);
      bVar4 = evaluate_no_dereference((IPGMContext *)local_60,&local_62);
      if (bVar4) {
        IPGMContext(__return_storage_ptr__,(IPGMContext *)local_60);
      }
      else {
        IPGMContext(__return_storage_ptr__);
      }
      local_68 = 1;
      ~IPGMContext((IPGMContext *)local_60);
    }
    r_code::Atom::~Atom((Atom *)&local_1c);
    break;
  case 0x87:
    pCVar14 = Overlay::getObject((this->super__Context).overlay);
    operator[](this,0);
    uVar7 = r_code::Atom::asIndex();
    IPGMContext((IPGMContext *)&input_object,pCVar14,uVar7);
    operator*(__return_storage_ptr__,(IPGMContext *)&input_object);
    ~IPGMContext((IPGMContext *)&input_object);
    break;
  case 0x88:
    pPVar1 = (PGMOverlay *)(this->super__Context).overlay;
    operator[](this,0);
    bVar6 = r_code::Atom::asInputIndex();
    pCVar14 = PGMOverlay::getInputObject(pPVar1,(ushort)bVar6);
    pPVar1 = (PGMOverlay *)(this->super__Context).overlay;
    operator[](this,0);
    bVar6 = r_code::Atom::asInputIndex();
    pVVar15 = (View *)PGMOverlay::getInputView(pPVar1,(ushort)bVar6);
    iVar11 = (*(pCVar14->super__Object)._vptr__Object[4])(pCVar14,0);
    operator[](this,0);
    uVar7 = r_code::Atom::asIndex();
    IPGMContext((IPGMContext *)&parent.view,pCVar14,pVVar15,(Atom *)CONCAT44(extraout_var_02,iVar11)
                ,uVar7,(InputLessPGMOverlay *)0x0,REFERENCE);
    operator*(__return_storage_ptr__,(IPGMContext *)&parent.view);
    ~IPGMContext((IPGMContext *)&parent.view);
    break;
  case 0x89:
    pCVar14 = this->object;
    pVVar15 = this->view;
    pAVar13 = r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
    operator[](this,0);
    uVar7 = r_code::Atom::asIndex();
    IPGMContext(__return_storage_ptr__,pCVar14,pVVar15,pAVar13,uVar7,
                (InputLessPGMOverlay *)(this->super__Context).overlay,VALUE_ARRAY);
    break;
  case 0x8a:
    pOVar2 = (this->super__Context).overlay;
    operator[](this,0);
    uVar8 = r_code::Atom::asIndex();
    this_00 = (P *)std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::
                   operator[]((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>
                               *)(pOVar2 + 1),(ulong)uVar8);
    pCVar14 = core::P::operator_cast_to_Code_(this_00);
    IPGMContext(__return_storage_ptr__,pCVar14,0);
    break;
  default:
    IPGMContext(__return_storage_ptr__,this);
    break;
  case 0x8c:
    pAVar13 = (this->super__Context).code;
    pCVar14 = this->object;
    pVVar15 = this->view;
    operator[](this,0);
    bVar6 = r_code::Atom::asRelativeIndex();
    IPGMContext((IPGMContext *)&parent_object,pCVar14,pVVar15,pAVar13,(ushort)bVar6,
                (InputLessPGMOverlay *)(this->super__Context).overlay,(this->super__Context).data);
    operator*((IPGMContext *)local_268,(IPGMContext *)&parent_object);
    ~IPGMContext((IPGMContext *)&parent_object);
    local_2a0 = parent.super__Context.index;
    uStack_29e = parent.super__Context._26_2_;
    DStack_29c = parent.super__Context.data;
    pAVar13 = (Atom *)(**(code **)(*(long *)parent.super__Context._24_8_ + 0x20))();
    operator[](this,0);
    uVar7 = r_code::Atom::asIndex();
    IPGMContext(&local_2d0,(Code *)parent.super__Context._24_8_,(View *)0x0,pAVar13,uVar7,
                (InputLessPGMOverlay *)0x0,REFERENCE);
    operator*(__return_storage_ptr__,&local_2d0);
    ~IPGMContext(&local_2d0);
    local_68 = 1;
    ~IPGMContext((IPGMContext *)local_268);
    break;
  case 0x90:
    pCVar14 = Overlay::getObject((this->super__Context).overlay);
    pVVar15 = Overlay::getView((this->super__Context).overlay);
    pCVar12 = Overlay::getObject((this->super__Context).overlay);
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    IPGMContext(__return_storage_ptr__,pCVar14,pVVar15,(Atom *)CONCAT44(extraout_var_01,iVar11),0,
                (InputLessPGMOverlay *)(this->super__Context).overlay,REFERENCE);
    break;
  case 0x91:
    if (((this->super__Context).overlay == (Overlay *)0x0) ||
       (pCVar14 = this->object, pCVar12 = Overlay::getObject((this->super__Context).overlay),
       pCVar14 != pCVar12)) {
      IPGMContext(__return_storage_ptr__,this);
    }
    else {
      pCVar14 = this->object;
      pVVar15 = this->view;
      pAVar13 = r_code::View::code(&this->view->super_View,0);
      IPGMContext(__return_storage_ptr__,pCVar14,pVVar15,pAVar13,0,(InputLessPGMOverlay *)0x0,VIEW);
    }
    break;
  case 0x92:
    IPGMContext(__return_storage_ptr__,this->object,MKS);
    break;
  case 0x93:
    IPGMContext(__return_storage_ptr__,this->object,VWS);
    break;
  case 0xc0:
    getChild((IPGMContext *)local_130,this,1);
    operator*((IPGMContext *)local_100,(IPGMContext *)local_130);
    ~IPGMContext((IPGMContext *)local_130);
    for (local_132 = 2; uVar9 = (uint)local_132,
        uVar10 = (*(this->super__Context)._vptr__Context[6])(), uVar9 <= (uVar10 & 0xffff);
        local_132 = local_132 + 1) {
      operator[](this,local_132);
      cVar5 = r_code::Atom::getDescriptor();
      if (cVar5 == -0x6f) {
        if (c.object == (Code *)0x0) {
          IPGMContext(__return_storage_ptr__);
          goto LAB_00210ca9;
        }
        pCVar12 = getObject((IPGMContext *)local_100);
        pCVar14 = c.object;
        pAVar13 = r_code::View::code((View *)c.object,0);
        IPGMContext(&local_168,pCVar12,(View *)pCVar14,pAVar13,0,(InputLessPGMOverlay *)0x0,VIEW);
        operator=((IPGMContext *)local_100,&local_168);
        ~IPGMContext(&local_168);
      }
      else {
        if (cVar5 == -0x6e) {
          pCVar14 = getObject((IPGMContext *)local_100);
          IPGMContext(__return_storage_ptr__,pCVar14,MKS);
          goto LAB_00210ca9;
        }
        if (cVar5 == -0x6d) {
          pCVar14 = getObject((IPGMContext *)local_100);
          IPGMContext(__return_storage_ptr__,pCVar14,VWS);
          goto LAB_00210ca9;
        }
        operator[](this,local_132);
        uVar7 = r_code::Atom::asIndex();
        getChild(&local_1c8,(IPGMContext *)local_100,uVar7);
        operator*(&local_198,&local_1c8);
        operator=((IPGMContext *)local_100,&local_198);
        ~IPGMContext(&local_198);
        ~IPGMContext(&local_1c8);
      }
    }
    IPGMContext(__return_storage_ptr__,(IPGMContext *)local_100);
LAB_00210ca9:
    local_68 = 1;
    ~IPGMContext((IPGMContext *)local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

IPGMContext IPGMContext::operator *() const
{
    switch ((*this)[0].getDescriptor()) {
    case Atom::VL_PTR: { // evaluate the code if necessary.
        // TODO: OPTIMIZATION: if not in a cptr and if this eventually points to an r-ptr or in-obj-ptr,
        // patch the code at this->index, i.e. replace the vl ptr by the in-obj-ptr or rptr.
        Atom a = code[(*this)[0].asIndex()];
        uint16_t structure_index;

        if (a.getDescriptor() == Atom::I_PTR) { // dereference once.
            a = code[structure_index = a.asIndex()];
        }

        if (a.isStructural()) { // the target location is not evaluated yet.
            IPGMContext s(object, view, code, structure_index, (InputLessPGMOverlay *)overlay, data);
            uint16_t unused_index;

            if (s.evaluate_no_dereference(unused_index)) {
                return s;    // patched code: atom at VL_PTR's index changed to VALUE_PTR or 32 bits result.
            } else { // evaluation failed, return undefined context.
                return IPGMContext();
            }
        } else {
            return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);
        }
    }

    case Atom::I_PTR:
        return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);

    case Atom::R_PTR: {
        Code *o = object->get_reference((*this)[0].asIndex());
        return IPGMContext(o, nullptr, &o->code(0), 0, nullptr, REFERENCE);
    }

    case Atom::C_PTR: {
        IPGMContext c = *getChild(1);

        for (uint16_t i = 2; i <= getChildrenCount(); ++i) {
            switch ((*this)[i].getDescriptor()) {
            case Atom::VIEW: // accessible only for this and input objects.
                if (c.view) {
                    c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
                } else {
                    return IPGMContext();
                }

                break;

            case Atom::MKS:
                return IPGMContext(c.getObject(), MKS);
                break;

            case Atom::VWS:
                return IPGMContext(c.getObject(), VWS);
                break;

            default:
                c = *c.getChild((*this)[i].asIndex());
            }
        }

        return c;
    }

    case Atom::THIS: // refers to the ipgm; the pgm view is not available.
        return IPGMContext(overlay->getObject(), overlay->getView(), &overlay->getObject()->code(0), 0, (InputLessPGMOverlay *)overlay, REFERENCE);

    case Atom::VIEW: // never a reference, always in a cptr.
        if (overlay && object == overlay->getObject()) {
            return IPGMContext(object, view, &view->code(0), 0, nullptr, VIEW);
        }

        return *this;

    case Atom::MKS:
        return IPGMContext(object, MKS);

    case Atom::VWS:
        return IPGMContext(object, VWS);

    case Atom::VALUE_PTR:
        return IPGMContext(object, view, &overlay->values[0], (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, VALUE_ARRAY);

    case Atom::IPGM_PTR:
        return *IPGMContext(overlay->getObject(), (*this)[0].asIndex());

    case Atom::IN_OBJ_PTR: {
        Code *input_object = ((PGMOverlay *)overlay)->getInputObject((*this)[0].asInputIndex());
        View *input_view = (r_exec::View*)((PGMOverlay *)overlay)->getInputView((*this)[0].asInputIndex());
        return *IPGMContext(input_object, input_view, &input_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::D_IN_OBJ_PTR: {
        IPGMContext parent = *IPGMContext(object, view, code, (*this)[0].asRelativeIndex(), (InputLessPGMOverlay *)overlay, data);
        Code *parent_object = parent.object;
        return *IPGMContext(parent_object, nullptr, &parent_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::PROD_PTR:
        return IPGMContext(((InputLessPGMOverlay *)overlay)->productions[(*this)[0].asIndex()], 0);

    default:
        return *this;
    }
}